

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void slang::ast::PrimitiveInstanceSymbol::fromSyntax
               (PrimitiveInstantiationSyntax *syntax,ASTContext *context,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets)

{
  Token *this;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  *this_01;
  Compilation *this_02;
  ResolvedConfig *pRVar1;
  Symbol *pSVar2;
  size_t sVar3;
  ConfigRule *configRule;
  uint uVar4;
  Token TVar5;
  Token TVar6;
  Token TVar7;
  Token TVar8;
  Token TVar9;
  Token TVar10;
  SyntaxListBase *pSVar11;
  bool bVar12;
  byte bVar13;
  byte bVar14;
  bool bVar15;
  uint uVar16;
  InstanceBodySymbol *pIVar17;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_03;
  Scope *pSVar18;
  int *piVar19;
  uint64_t uVar20;
  PrimitiveSymbol *primitive;
  ulong uVar21;
  basic_string_view<char,_std::char_traits<char>_> *pbVar22;
  long lVar23;
  pointer ppSVar24;
  type *defResult_2;
  SourceLocation SVar25;
  SourceLocation SVar26;
  ParentList *pPVar27;
  basic_string_view<char,_std::char_traits<char>_> *pbVar28;
  char *pcVar29;
  size_type sVar30;
  size_type sVar31;
  ConfigBlockSymbol *configBlock;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 uVar35;
  undefined1 uVar36;
  char cVar37;
  NumericTokenFlags NVar38;
  undefined1 uVar39;
  undefined1 uVar40;
  char cVar41;
  char cVar42;
  char cVar43;
  byte bVar44;
  undefined1 uVar45;
  char cVar46;
  undefined1 uVar47;
  char cVar48;
  char cVar49;
  char cVar50;
  byte bVar51;
  undefined1 uVar52;
  char cVar53;
  undefined1 uVar54;
  char cVar55;
  char cVar56;
  char cVar57;
  byte bVar58;
  string_view lookupName;
  Token TVar59;
  Symbol *sym;
  const_iterator __begin0;
  anon_class_48_6_08dfe5ab createPrims;
  DefinitionLookupResult defResult_1;
  SmallVector<const_slang::ast::Symbol_*,_5UL> parentStack;
  DefinitionLookupResult defResult;
  string_view rootName;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  implicitNetNames;
  iterator local_308;
  ConfigRule *local_2f8;
  SourceLocation local_2f0;
  SourceLocation local_2e8;
  char cStack_2e0;
  char cStack_2df;
  char cStack_2de;
  byte bStack_2dd;
  char cStack_2dc;
  char cStack_2db;
  char cStack_2da;
  byte bStack_2d9;
  ConfigRule *local_2d8;
  ParentList *local_2d0;
  string_view local_2c8;
  undefined8 local_2b8;
  char cStack_2b0;
  char cStack_2af;
  char cStack_2ae;
  byte bStack_2ad;
  char cStack_2ac;
  char cStack_2ab;
  char cStack_2aa;
  byte bStack_2a9;
  Compilation *local_2a8;
  Token local_2a0;
  iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*> local_290;
  __extent_storage<18446744073709551615UL> local_280;
  pointer local_278;
  __extent_storage<18446744073709551615UL> local_270;
  Compilation *local_268;
  SourceRange local_260;
  SourceRange local_250;
  SourceRange local_240;
  anon_class_48_6_08dfe5ab local_230;
  DefinitionLookupResult local_200;
  char local_1e8;
  char cStack_1e7;
  char cStack_1e6;
  byte bStack_1e5;
  char cStack_1e4;
  char cStack_1e3;
  char cStack_1e2;
  byte bStack_1e1;
  char cStack_1e0;
  char cStack_1df;
  char cStack_1de;
  byte bStack_1dd;
  char cStack_1dc;
  char cStack_1db;
  char cStack_1da;
  byte bStack_1d9;
  bool local_1d8;
  char cStack_1d7;
  char cStack_1d6;
  byte bStack_1d5;
  char cStack_1d4;
  char cStack_1d3;
  char cStack_1d2;
  byte bStack_1d1;
  char cStack_1d0;
  char cStack_1cf;
  char cStack_1ce;
  byte bStack_1cd;
  char cStack_1cc;
  char cStack_1cb;
  char cStack_1ca;
  byte bStack_1c9;
  char local_1c8;
  char cStack_1c7;
  char cStack_1c6;
  byte bStack_1c5;
  char cStack_1c4;
  char cStack_1c3;
  char cStack_1c2;
  byte bStack_1c1;
  char cStack_1c0;
  char cStack_1bf;
  char cStack_1be;
  byte bStack_1bd;
  char cStack_1bc;
  char cStack_1bb;
  char cStack_1ba;
  byte bStack_1b9;
  char local_1b8;
  char cStack_1b7;
  char cStack_1b6;
  byte bStack_1b5;
  char cStack_1b4;
  char cStack_1b3;
  char cStack_1b2;
  byte bStack_1b1;
  char cStack_1b0;
  char cStack_1af;
  char cStack_1ae;
  byte bStack_1ad;
  char cStack_1ac;
  char cStack_1ab;
  char cStack_1aa;
  byte bStack_1a9;
  SmallVectorBase<const_slang::ast::Symbol_*> local_1a0 [2];
  SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
  local_160;
  undefined1 local_108 [152];
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  local_70;
  
  this_01 = (SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
             *)(local_108 + 0x10);
  SVar26 = (SourceLocation)context;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::SmallSet(this_01);
  this_02 = ((context->scope).ptr)->compilation;
  this = &syntax->type;
  lookupName = parsing::Token::valueText(this);
  if (this->kind != Identifier) {
    primitive = Compilation::getGateType(this_02,lookupName);
    anon_unknown_287::createPrimitives<slang::syntax::PrimitiveInstantiationSyntax>
              (primitive,syntax,(HierarchicalInstanceSyntax *)0x0,context,results,implicitNets,
               this_01);
    goto LAB_0029836f;
  }
  local_2c8 = lookupName;
  local_268 = this_02;
  local_230.syntax = syntax;
  local_230.context = context;
  local_230.results = results;
  local_230.implicitNets = implicitNets;
  local_230.implicitNetNames = this_01;
  local_230.comp = this_02;
  pIVar17 = Scope::getContainingInstance((context->scope).ptr);
  TVar10.info = local_2a0.info;
  TVar10.kind = local_2a0.kind;
  TVar10._2_1_ = local_2a0._2_1_;
  TVar10.numFlags.raw = local_2a0.numFlags.raw;
  TVar10.rawLen = local_2a0.rawLen;
  TVar9.info = local_2a0.info;
  TVar9.kind = local_2a0.kind;
  TVar9._2_1_ = local_2a0._2_1_;
  TVar9.numFlags.raw = local_2a0.numFlags.raw;
  TVar9.rawLen = local_2a0.rawLen;
  TVar59.info = local_2a0.info;
  TVar59.kind = local_2a0.kind;
  TVar59._2_1_ = local_2a0._2_1_;
  TVar59.numFlags.raw = local_2a0.numFlags.raw;
  TVar59.rawLen = local_2a0.rawLen;
  if (((pIVar17 != (InstanceBodySymbol *)0x0) &&
      (TVar59 = TVar9, pIVar17->parentInstance != (InstanceSymbol *)0x0)) &&
     (pRVar1 = pIVar17->parentInstance->resolvedConfig, TVar59 = TVar10,
     pRVar1 != (ResolvedConfig *)0x0)) {
    local_160.data_ = (pointer)local_160.firstElement;
    local_160.len = 0;
    local_160.cap = 2;
    this_03 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
              ConfigBlockSymbol::getInstanceOverrides(pRVar1->useConfig);
    TVar8.info = local_2a0.info;
    TVar8.kind = local_2a0.kind;
    TVar8._2_1_ = local_2a0._2_1_;
    TVar8.numFlags.raw = local_2a0.numFlags.raw;
    TVar8.rawLen = local_2a0.rawLen;
    if (*(long *)(this_03 + 0x28) != 0) {
      pSVar18 = (context->scope).ptr;
      local_1a0[0].data_ = (pointer)local_1a0[0].firstElement;
      local_1a0[0].len = 0;
      local_1a0[0].cap = 5;
      do {
        pSVar2 = pSVar18->thisSym;
        if (pSVar2->kind == InstanceBody) {
          pSVar2 = (Symbol *)pSVar2[1].originatingSyntax;
        }
        local_308.pc_ = (char_pointer)pSVar2;
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*const&>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)local_1a0,(Symbol **)&local_308);
        pSVar18 = (((InstanceSymbolBase *)local_308.pc_)->super_Symbol).parentScope;
      } while ((pSVar18 != (Scope *)0x0) &&
              (pRVar1->rootInstance != (InstanceSymbol *)local_308.pc_));
      piVar19 = *(int **)((long)local_1a0[0].data_ + (local_1a0[0].len - 1) * 8);
      if (*piVar19 == 0x2f) {
        piVar19 = *(int **)(*(long *)(piVar19 + 0x14) + 0x90);
      }
      local_108._0_4_ = piVar19[2];
      local_108._4_4_ = piVar19[3];
      local_108._8_8_ = *(undefined8 *)(piVar19 + 4);
      uVar20 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         (this_03,(basic_string_view<char,_std::char_traits<char>_> *)local_108);
      uVar21 = uVar20 >> ((byte)*this_03 & 0x3f);
      lVar23 = (uVar20 & 0xff) * 4;
      uVar35 = (&UNK_004a00ac)[lVar23];
      uVar36 = (&UNK_004a00ad)[lVar23];
      cVar37 = (&UNK_004a00ae)[lVar23];
      NVar38.raw = (&UNK_004a00af)[lVar23];
      SVar26 = (SourceLocation)0x0;
      uVar39 = uVar35;
      uVar40 = uVar36;
      cVar42 = cVar37;
      bVar44 = NVar38.raw;
      uVar45 = uVar35;
      uVar47 = uVar36;
      cVar49 = cVar37;
      bVar51 = NVar38.raw;
      uVar52 = uVar35;
      uVar54 = uVar36;
      cVar56 = cVar37;
      bVar58 = NVar38.raw;
      do {
        pcVar29 = (char *)(*(long *)(this_03 + 0x10) + uVar21 * 0x10);
        local_1b8 = *pcVar29;
        cStack_1b7 = pcVar29[1];
        cStack_1b6 = pcVar29[2];
        bStack_1b5 = pcVar29[3];
        cStack_1b4 = pcVar29[4];
        cStack_1b3 = pcVar29[5];
        cStack_1b2 = pcVar29[6];
        bStack_1b1 = pcVar29[7];
        cStack_1b0 = pcVar29[8];
        cStack_1af = pcVar29[9];
        cStack_1ae = pcVar29[10];
        bStack_1ad = pcVar29[0xb];
        cStack_1ac = pcVar29[0xc];
        cStack_1ab = pcVar29[0xd];
        cStack_1aa = pcVar29[0xe];
        bVar13 = pcVar29[0xf];
        auVar32[0] = -(local_1b8 == uVar35);
        auVar32[1] = -(cStack_1b7 == uVar36);
        auVar32[2] = -(cStack_1b6 == cVar37);
        auVar32[3] = -(bStack_1b5 == NVar38.raw);
        auVar32[4] = -(cStack_1b4 == uVar39);
        auVar32[5] = -(cStack_1b3 == uVar40);
        auVar32[6] = -(cStack_1b2 == cVar42);
        auVar32[7] = -(bStack_1b1 == bVar44);
        auVar32[8] = -(cStack_1b0 == uVar45);
        auVar32[9] = -(cStack_1af == uVar47);
        auVar32[10] = -(cStack_1ae == cVar49);
        auVar32[0xb] = -(bStack_1ad == bVar51);
        auVar32[0xc] = -(cStack_1ac == uVar52);
        auVar32[0xd] = -(cStack_1ab == uVar54);
        auVar32[0xe] = -(cStack_1aa == cVar56);
        auVar32[0xf] = -(bVar13 == bVar58);
        uVar16 = (uint)(ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe);
        bStack_1a9 = bVar13;
        if (uVar16 != 0) {
          local_2e8._1_1_ = uVar36;
          local_2e8._0_1_ = uVar35;
          local_2e8._2_1_ = cVar37;
          local_2e8._3_1_ = NVar38.raw;
          local_2e8._4_1_ = uVar39;
          local_2e8._5_1_ = uVar40;
          local_2e8._6_1_ = cVar42;
          local_2e8._7_1_ = bVar44;
          local_2b8 = (ConfigBlockSymbol *)(*(long *)(this_03 + 0x10) + uVar21 * 0x10);
          lVar23 = *(long *)(this_03 + 0x18);
          cStack_2e0 = uVar45;
          cStack_2df = uVar47;
          cStack_2de = cVar49;
          bStack_2dd = bVar51;
          cStack_2dc = uVar52;
          cStack_2db = uVar54;
          cStack_2da = cVar56;
          bStack_2d9 = bVar58;
          do {
            uVar4 = 0;
            if (uVar16 != 0) {
              for (; (uVar16 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
              }
            }
            pbVar22 = (basic_string_view<char,_std::char_traits<char>_> *)
                      ((ulong)uVar4 * 0x48 + lVar23 + uVar21 * 0x438);
            SVar25 = (SourceLocation)local_108;
            bVar12 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                     operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                                this_03,(basic_string_view<char,_std::char_traits<char>_> *)
                                        local_108,pbVar22);
            sVar30 = local_1a0[0].len;
            if (bVar12) goto LAB_00297d5d;
            uVar16 = uVar16 - 1 & uVar16;
          } while (uVar16 != 0);
          bVar13 = *(byte *)((long)&(local_2b8->super_Symbol).name._M_len + 7);
          uVar35 = local_2e8._0_1_;
          uVar36 = local_2e8._1_1_;
          cVar37 = local_2e8._2_1_;
          NVar38.raw = local_2e8._3_1_;
          uVar39 = local_2e8._4_1_;
          uVar40 = local_2e8._5_1_;
          cVar42 = local_2e8._6_1_;
          bVar44 = local_2e8._7_1_;
          uVar45 = cStack_2e0;
          uVar47 = cStack_2df;
          cVar49 = cStack_2de;
          bVar51 = bStack_2dd;
          uVar52 = cStack_2dc;
          uVar54 = cStack_2db;
          cVar56 = cStack_2da;
          bVar58 = bStack_2d9;
        }
        TVar6.info = local_2a0.info;
        TVar6.kind = local_2a0.kind;
        TVar6._2_1_ = local_2a0._2_1_;
        TVar6.numFlags.raw = local_2a0.numFlags.raw;
        TVar6.rawLen = local_2a0.rawLen;
        TVar5.info = local_2a0.info;
        TVar5.kind = local_2a0.kind;
        TVar5._2_1_ = local_2a0._2_1_;
        TVar5.numFlags.raw = local_2a0.numFlags.raw;
        TVar5.rawLen = local_2a0.rawLen;
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7] & bVar13) == 0) break;
        lVar23 = uVar21 + (long)SVar26;
        SVar26 = (SourceLocation)((long)SVar26 + 1);
        uVar21 = lVar23 + 1U & (ulong)*(SourceLocation *)(this_03 + 8);
        TVar5 = TVar6;
      } while ((ulong)SVar26 <= (ulong)*(SourceLocation *)(this_03 + 8));
      goto LAB_00298291;
    }
    goto LAB_002982a3;
  }
  goto LAB_00298303;
LAB_00297d5d:
  pbVar28 = pbVar22;
  TVar5.info = local_2a0.info;
  TVar5.kind = local_2a0.kind;
  TVar5._2_1_ = local_2a0._2_1_;
  TVar5.numFlags.raw = local_2a0.numFlags.raw;
  TVar5.rawLen = local_2a0.rawLen;
  this_00 = pbVar28 + 1;
  sVar31 = sVar30 - 1;
  if (sVar31 == 0) {
    SVar26 = SVar25;
    if (pbVar28[3]._M_str != (char *)0x0) {
      local_2a8 = ((context->scope).ptr)->compilation;
      local_2d0 = &syntax->instances;
      local_290.index = 0;
      local_280._M_extent_value = (syntax->instances).elements._M_extent._M_extent_value + 1 >> 1;
      bVar12 = false;
      local_290.list = local_2d0;
      local_2a0 = TVar5;
      for (; (local_290.list != local_2d0 ||
             (SVar26 = SVar25, TVar5 = local_2a0, local_290.index != local_280._M_extent_value));
          local_290.index = (long)(DefinitionSymbol **)local_290.index + 1) {
        local_2e8 = (SourceLocation)
                    slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::
                    iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>::dereference
                              (&local_290);
        if (*(SourceLocation *)((long)local_2e8 + 0x18) == (SourceLocation)0x0) {
          TVar59 = (Token)(ZEXT816(0x489e8d) << 0x40);
        }
        else {
          TVar59 = (Token)parsing::Token::valueText
                                    ((Token *)((long)*(SourceLocation *)((long)local_2e8 + 0x18) +
                                              0x18));
        }
        local_2a0 = TVar59;
        uVar20 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            this_00,(basic_string_view<char,_std::char_traits<char>_> *)&local_2a0);
        uVar21 = uVar20 >> ((byte)this_00->_M_len & 0x3f);
        lVar23 = (uVar20 & 0xff) * 4;
        cVar37 = (&UNK_004a00ac)[lVar23];
        cVar42 = (&UNK_004a00ad)[lVar23];
        cVar49 = (&UNK_004a00ae)[lVar23];
        bVar44 = (&UNK_004a00af)[lVar23];
        ppSVar24 = (pointer)0x0;
        cVar56 = cVar37;
        cVar41 = cVar42;
        cVar43 = cVar49;
        bVar51 = bVar44;
        cVar46 = cVar37;
        cVar48 = cVar42;
        cVar50 = cVar49;
        bVar58 = bVar44;
        cVar53 = cVar37;
        cVar55 = cVar42;
        cVar57 = cVar49;
        bVar13 = bVar44;
        do {
          sVar3 = pbVar28[2]._M_len;
          pcVar29 = (char *)(sVar3 + uVar21 * 0x10);
          local_1d8 = (bool)*pcVar29;
          cStack_1d7 = pcVar29[1];
          cStack_1d6 = pcVar29[2];
          bStack_1d5 = pcVar29[3];
          cStack_1d4 = pcVar29[4];
          cStack_1d3 = pcVar29[5];
          cStack_1d2 = pcVar29[6];
          bStack_1d1 = pcVar29[7];
          cStack_1d0 = pcVar29[8];
          cStack_1cf = pcVar29[9];
          cStack_1ce = pcVar29[10];
          bStack_1cd = pcVar29[0xb];
          cStack_1cc = pcVar29[0xc];
          cStack_1cb = pcVar29[0xd];
          cStack_1ca = pcVar29[0xe];
          bVar14 = pcVar29[0xf];
          auVar34[0] = -(local_1d8 == (bool)cVar37);
          auVar34[1] = -(cStack_1d7 == cVar42);
          auVar34[2] = -(cStack_1d6 == cVar49);
          auVar34[3] = -(bStack_1d5 == bVar44);
          auVar34[4] = -(cStack_1d4 == cVar56);
          auVar34[5] = -(cStack_1d3 == cVar41);
          auVar34[6] = -(cStack_1d2 == cVar43);
          auVar34[7] = -(bStack_1d1 == bVar51);
          auVar34[8] = -(cStack_1d0 == cVar46);
          auVar34[9] = -(cStack_1cf == cVar48);
          auVar34[10] = -(cStack_1ce == cVar50);
          auVar34[0xb] = -(bStack_1cd == bVar58);
          auVar34[0xc] = -(cStack_1cc == cVar53);
          auVar34[0xd] = -(cStack_1cb == cVar55);
          auVar34[0xe] = -(cStack_1ca == cVar57);
          auVar34[0xf] = -(bVar14 == bVar13);
          uVar16 = (uint)(ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe);
          bStack_1c9 = bVar14;
          if (uVar16 != 0) {
            pcVar29 = pbVar28[2]._M_str;
            local_278 = ppSVar24;
            local_1e8 = cVar37;
            cStack_1e7 = cVar42;
            cStack_1e6 = cVar49;
            bStack_1e5 = bVar44;
            cStack_1e4 = cVar56;
            cStack_1e3 = cVar41;
            cStack_1e2 = cVar43;
            bStack_1e1 = bVar51;
            cStack_1e0 = cVar46;
            cStack_1df = cVar48;
            cStack_1de = cVar50;
            bStack_1dd = bVar58;
            cStack_1dc = cVar53;
            cStack_1db = cVar55;
            cStack_1da = cVar57;
            bStack_1d9 = bVar13;
            do {
              uVar4 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                }
              }
              pbVar22 = (basic_string_view<char,_std::char_traits<char>_> *)
                        (pcVar29 + (ulong)uVar4 * 0x48 + uVar21 * 0x438);
              bVar15 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                       operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   *)this_00,
                                  (basic_string_view<char,_std::char_traits<char>_> *)&local_2a0,
                                  pbVar22);
              SVar26 = local_2e8;
              if (bVar15) {
                configRule = (ConfigRule *)pbVar22[4]._M_len;
                if (configRule == (ConfigRule *)0x0) {
                  bVar15 = false;
                  goto LAB_00298159;
                }
                pSVar18 = (context->scope).ptr;
                local_240 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_2e8);
                Compilation::getDefinition
                          (&local_200,local_2a8,local_2c8,pSVar18,configRule,local_240,
                           (DiagCode)0xd10006);
                local_2f8 = local_200.configRule;
                local_308.p_ = (table_element_pointer)local_200.configRoot;
                local_308.pc_ = (char_pointer)local_200.definition;
                local_2f0 = SVar26;
                SVar25 = (SourceLocation)&local_308;
                SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                ::
                emplace_back<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                          ((SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                            *)&local_160,
                           (pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
                            *)SVar25);
                bVar15 = false;
                configBlock = local_200.configRoot;
                goto LAB_00298221;
              }
              uVar16 = uVar16 - 1 & uVar16;
            } while (uVar16 != 0);
            bVar14 = *(byte *)(sVar3 + uVar21 * 0x10 + 0xf);
            ppSVar24 = local_278;
            cVar37 = local_1e8;
            cVar42 = cStack_1e7;
            cVar49 = cStack_1e6;
            bVar44 = bStack_1e5;
            cVar56 = cStack_1e4;
            cVar41 = cStack_1e3;
            cVar43 = cStack_1e2;
            bVar51 = bStack_1e1;
            cVar46 = cStack_1e0;
            cVar48 = cStack_1df;
            cVar50 = cStack_1de;
            bVar58 = bStack_1dd;
            cVar53 = cStack_1dc;
            cVar55 = cStack_1db;
            cVar57 = cStack_1da;
            bVar13 = bStack_1d9;
          }
          bVar15 = true;
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7] & bVar14) == 0) {
            pbVar22 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
            goto LAB_00298159;
          }
          pcVar29 = (char *)((long)ppSVar24 + uVar21 + 1);
          ppSVar24 = (pointer)((long)ppSVar24 + 1);
          uVar21 = (ulong)pcVar29 & (ulong)pbVar28[1]._M_str;
        } while (ppSVar24 <= pbVar28[1]._M_str);
        pbVar22 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
LAB_00298159:
        configBlock = local_2b8;
        if (!bVar12) {
          pSVar18 = (context->scope).ptr;
          local_250 = parsing::Token::range(this);
          Compilation::getDefinition
                    ((DefinitionLookupResult *)&local_308,local_2a8,local_2c8,pSVar18,local_250,
                     (DiagCode)0xd10006);
          local_270._M_extent_value = (size_t)local_308.pc_;
          local_2d8 = local_2f8;
          configBlock = (ConfigBlockSymbol *)local_308.p_;
        }
        local_308.p_ = (table_element_pointer)configBlock;
        local_308.pc_ = (char_pointer)local_270._M_extent_value;
        local_2f8 = local_2d8;
        local_2f0 = local_2e8;
        SVar25 = (SourceLocation)&local_308;
        SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
        ::
        emplace_back<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                  ((SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                    *)&local_160,
                   (pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
                    *)SVar25);
        bVar12 = true;
        local_2b8 = configBlock;
LAB_00298221:
        if ((!bVar15) && (configBlock != (ConfigBlockSymbol *)0x0)) {
          local_308 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                      ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                               *)(pbVar22 + 1));
          while (SVar25 = (SourceLocation)local_308.p_,
                (SourceLocation)local_308.p_ != (SourceLocation)0x0) {
            anon_unknown.dwarf_beab97::checkForInvalidNestedConfigNodes
                      (context,(InstanceOverride *)((long)local_308.p_ + 0x10),configBlock);
            boost::unordered::detail::foa::
            table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
            ::increment((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                         *)&local_308);
          }
        }
      }
    }
  }
  else {
    SVar25 = (SourceLocation)(*(long *)((long)local_1a0[0].data_ + (sVar30 - 2) * 8) + 8);
    uVar20 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this_00
                        ,(basic_string_view<char,_std::char_traits<char>_> *)SVar25);
    SVar26 = (SourceLocation)(uVar20 >> ((byte)pbVar28[1]._M_len & 0x3f));
    lVar23 = (uVar20 & 0xff) * 4;
    cVar37 = (&UNK_004a00ac)[lVar23];
    cVar42 = (&UNK_004a00ad)[lVar23];
    cVar49 = (&UNK_004a00ae)[lVar23];
    bVar44 = (&UNK_004a00af)[lVar23];
    pPVar27 = (ParentList *)0x0;
    cVar56 = cVar37;
    cVar41 = cVar42;
    cVar43 = cVar49;
    bVar51 = bVar44;
    cVar46 = cVar37;
    cVar48 = cVar42;
    cVar50 = cVar49;
    bVar58 = bVar44;
    cVar53 = cVar37;
    cVar55 = cVar42;
    cVar57 = cVar49;
    bVar13 = bVar44;
    do {
      pcVar29 = (char *)(pbVar28[2]._M_len + (long)SVar26 * 0x10);
      local_1c8 = *pcVar29;
      cStack_1c7 = pcVar29[1];
      cStack_1c6 = pcVar29[2];
      bStack_1c5 = pcVar29[3];
      cStack_1c4 = pcVar29[4];
      cStack_1c3 = pcVar29[5];
      cStack_1c2 = pcVar29[6];
      bStack_1c1 = pcVar29[7];
      cStack_1c0 = pcVar29[8];
      cStack_1bf = pcVar29[9];
      cStack_1be = pcVar29[10];
      bStack_1bd = pcVar29[0xb];
      cStack_1bc = pcVar29[0xc];
      cStack_1bb = pcVar29[0xd];
      cStack_1ba = pcVar29[0xe];
      bVar14 = pcVar29[0xf];
      auVar33[0] = -(local_1c8 == cVar37);
      auVar33[1] = -(cStack_1c7 == cVar42);
      auVar33[2] = -(cStack_1c6 == cVar49);
      auVar33[3] = -(bStack_1c5 == bVar44);
      auVar33[4] = -(cStack_1c4 == cVar56);
      auVar33[5] = -(cStack_1c3 == cVar41);
      auVar33[6] = -(cStack_1c2 == cVar43);
      auVar33[7] = -(bStack_1c1 == bVar51);
      auVar33[8] = -(cStack_1c0 == cVar46);
      auVar33[9] = -(cStack_1bf == cVar48);
      auVar33[10] = -(cStack_1be == cVar50);
      auVar33[0xb] = -(bStack_1bd == bVar58);
      auVar33[0xc] = -(cStack_1bc == cVar53);
      auVar33[0xd] = -(cStack_1bb == cVar55);
      auVar33[0xe] = -(cStack_1ba == cVar57);
      auVar33[0xf] = -(bVar14 == bVar13);
      uVar16 = (uint)(ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe);
      bStack_1b9 = bVar14;
      if (uVar16 != 0) {
        local_2b8 = (ConfigBlockSymbol *)
                    CONCAT17(bVar51,CONCAT16(cVar43,CONCAT15(cVar41,CONCAT14(cVar56,CONCAT13(bVar44,
                                                  CONCAT12(cVar49,CONCAT11(cVar42,cVar37)))))));
        local_2d8 = (ConfigRule *)(pbVar28[2]._M_len + (long)SVar26 * 0x10);
        pcVar29 = pbVar28[2]._M_str;
        local_2e8 = SVar25;
        local_2d0 = pPVar27;
        cStack_2b0 = cVar46;
        cStack_2af = cVar48;
        cStack_2ae = cVar50;
        bStack_2ad = bVar58;
        cStack_2ac = cVar53;
        cStack_2ab = cVar55;
        cStack_2aa = cVar57;
        bStack_2a9 = bVar13;
        do {
          uVar4 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
            }
          }
          SVar25 = local_2e8;
          bVar12 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                             ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              this_00,(basic_string_view<char,_std::char_traits<char>_> *)local_2e8,
                              (basic_string_view<char,_std::char_traits<char>_> *)
                              (pcVar29 + (ulong)uVar4 * 0x48 + (long)SVar26 * 0x438));
          pbVar22 = (basic_string_view<char,_std::char_traits<char>_> *)
                    (pcVar29 + (ulong)uVar4 * 0x48 + (long)SVar26 * 0x438);
          sVar30 = sVar31;
          if (bVar12) goto LAB_00297d5d;
          uVar16 = uVar16 - 1 & uVar16;
        } while (uVar16 != 0);
        bVar14 = *(byte *)((long)&(local_2d8->liblist).
                                  super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                                  ._M_payload.
                                  super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                                  ._M_payload + 0xf);
        pPVar27 = local_2d0;
        SVar25 = local_2e8;
        cVar37 = (char)local_2b8;
        cVar42 = local_2b8._1_1_;
        cVar49 = local_2b8._2_1_;
        bVar44 = local_2b8._3_1_;
        cVar56 = local_2b8._4_1_;
        cVar41 = local_2b8._5_1_;
        cVar43 = local_2b8._6_1_;
        bVar51 = local_2b8._7_1_;
        cVar46 = cStack_2b0;
        cVar48 = cStack_2af;
        cVar50 = cStack_2ae;
        bVar58 = bStack_2ad;
        cVar53 = cStack_2ac;
        cVar55 = cStack_2ab;
        cVar57 = cStack_2aa;
        bVar13 = bStack_2a9;
      }
      TVar7.info = local_2a0.info;
      TVar7.kind = local_2a0.kind;
      TVar7._2_1_ = local_2a0._2_1_;
      TVar7.numFlags.raw = local_2a0.numFlags.raw;
      TVar7.rawLen = local_2a0.rawLen;
      TVar5.info = local_2a0.info;
      TVar5.kind = local_2a0.kind;
      TVar5._2_1_ = local_2a0._2_1_;
      TVar5.numFlags.raw = local_2a0.numFlags.raw;
      TVar5.rawLen = local_2a0.rawLen;
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7] & bVar14) == 0) break;
      pSVar11 = &pPVar27->super_SyntaxListBase;
      pPVar27 = (ParentList *)((long)&(pPVar27->super_SyntaxListBase)._vptr_SyntaxListBase + 1);
      SVar26 = (SourceLocation)
               ((ulong)((byte *)((long)SVar26 + 1) + (long)&pSVar11->_vptr_SyntaxListBase) &
               (ulong)pbVar28[1]._M_str);
      TVar5 = TVar7;
    } while (pPVar27 <= (ParentList *)pbVar28[1]._M_str);
  }
LAB_00298291:
  local_2a0 = TVar5;
  SmallVectorBase<const_slang::ast::Symbol_*>::cleanup(local_1a0,(EVP_PKEY_CTX *)SVar26);
  TVar8 = local_2a0;
LAB_002982a3:
  local_2a0 = TVar8;
  if (local_160.len != 0) {
    SVar25 = (SourceLocation)local_160.data_;
    for (lVar23 = local_160.len << 5; lVar23 != 0; lVar23 = lVar23 + -0x20) {
      SVar26 = SVar25;
      fromSyntax::anon_class_48_6_08dfe5ab::operator()
                (&local_230,(DefinitionLookupResult *)SVar25,
                 (HierarchicalInstanceSyntax *)*(SourceLocation *)((long)SVar25 + 0x18));
      SVar25 = (SourceLocation)((long)SVar25 + 0x20);
    }
    SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
    ::cleanup(&local_160,(EVP_PKEY_CTX *)SVar26);
    goto LAB_0029836f;
  }
  SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
  ::cleanup(&local_160,(EVP_PKEY_CTX *)SVar26);
  TVar59 = local_2a0;
LAB_00298303:
  pSVar18 = (context->scope).ptr;
  local_2a0 = TVar59;
  local_260 = parsing::Token::range(this);
  Compilation::getDefinition
            ((DefinitionLookupResult *)&local_160,local_268,local_2c8,pSVar18,local_260,
             (DiagCode)0xd10006);
  fromSyntax::anon_class_48_6_08dfe5ab::operator()
            (&local_230,(DefinitionLookupResult *)&local_160,(HierarchicalInstanceSyntax *)0x0);
LAB_0029836f:
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::~table_core(&local_70);
  return;
}

Assistant:

void PrimitiveInstanceSymbol::fromSyntax(const PrimitiveInstantiationSyntax& syntax,
                                         const ASTContext& context,
                                         SmallVectorBase<const Symbol*>& results,
                                         SmallVectorBase<const Symbol*>& implicitNets) {
    SmallSet<std::string_view, 8> implicitNetNames;
    auto& comp = context.getCompilation();
    auto name = syntax.type.valueText();

    // If the type is not an identifier then it should be a gate keyword.
    if (syntax.type.kind != TokenKind::Identifier) {
        auto prim = comp.getGateType(name);
        SLANG_ASSERT(prim);
        createPrimitives(*prim, syntax, nullptr, context, results, implicitNets, implicitNetNames);
        return;
    }

    auto createPrims = [&](const Compilation::DefinitionLookupResult& defResult,
                           const HierarchicalInstanceSyntax* specificInstance) {
        if (defResult.configRule)
            defResult.configRule->isUsed = true;

        auto def = defResult.definition;
        if (def) {
            if (def->kind == SymbolKind::Primitive) {
                createPrimitives(def->as<PrimitiveSymbol>(), syntax, specificInstance, context,
                                 results, implicitNets, implicitNetNames);
                return;
            }

            SLANG_ASSERT(syntax.strength || syntax.delay);
            if (syntax.strength) {
                auto& diag = context.addDiag(diag::InstanceWithStrength,
                                             syntax.strength->sourceRange());
                diag << def->name;
                if (specificInstance)
                    diag << specificInstance->sourceRange();
            }
            else if (comp.hasFlag(CompilationFlags::AllowBareValParamAssignment) &&
                     syntax.delay->kind == SyntaxKind::DelayControl) {
                // We're allowing this to be a hierarchical instantiation with a single param
                // assignment, and just pretending the parentheses were provided.
                auto& delaySyntax = syntax.delay->as<DelaySyntax>();
                auto& delayVal = *delaySyntax.delayValue;

                SmallVector<TokenOrSyntax> parameters;
                parameters.push_back(comp.emplace<OrderedParamAssignmentSyntax>(delayVal));

                auto missing = [&](TokenKind tk, SourceLocation loc) {
                    return Token::createMissing(comp, tk, loc);
                };

                auto pvas = comp.emplace<ParameterValueAssignmentSyntax>(
                    delaySyntax.hash,
                    missing(TokenKind::OpenParenthesis, delayVal.getFirstToken().location()),
                    parameters.copy(comp),
                    missing(TokenKind::CloseParenthesis, delayVal.getLastToken().location()));

                // Rebuild the instance list. The const_casts are fine because
                // we're going to immediately treat them as const again below.
                SmallVector<TokenOrSyntax> instanceBuf;
                if (specificInstance) {
                    instanceBuf.push_back(
                        const_cast<HierarchicalInstanceSyntax*>(specificInstance));
                }
                else {
                    for (auto inst : syntax.instances)
                        instanceBuf.push_back(const_cast<HierarchicalInstanceSyntax*>(inst));
                }

                auto instantiation = comp.emplace<HierarchyInstantiationSyntax>(
                    syntax.attributes, syntax.type, pvas, instanceBuf.copy(comp), syntax.semi);
                InstanceSymbol::fromSyntax(comp, *instantiation, context, results, implicitNets);
                return;
            }
            else {
                auto& diag = context.addDiag(diag::InstanceWithDelay,
                                             syntax.delay->getFirstToken().location() + 1);
                if (specificInstance)
                    diag << specificInstance->sourceRange();
            }
        }
        UninstantiatedDefSymbol::fromSyntax(comp, syntax, specificInstance, context, results,
                                            implicitNets, implicitNetNames);
    };

    // Check if there are configuration instance override paths to check.
    auto parentInst = context.scope->getContainingInstance();
    if (parentInst && parentInst->parentInstance && parentInst->parentInstance->resolvedConfig) {
        ResolvedInstanceRules instanceRules;
        resolveInstanceOverrides(*parentInst->parentInstance->resolvedConfig, context, syntax, name,
                                 diag::UnknownPrimitive, instanceRules);
        if (!instanceRules.empty()) {
            for (auto& [defResult, instSyntax] : instanceRules)
                createPrims(defResult, instSyntax);
            return;
        }
    }

    // Simple case; just create the primitive instances.
    auto defResult = comp.getDefinition(name, *context.scope, syntax.type.range(),
                                        diag::UnknownPrimitive);
    createPrims(defResult, nullptr);
}